

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__mad4sizes_valid(int a,int b,int c,int d,int add)

{
  uint uVar1;
  
  if (-1 < (b | a)) {
    if ((b != 0) && ((int)(0x7fffffff / (ulong)(uint)b) < a)) {
      return 0;
    }
    uVar1 = b * a;
    if (-1 < (int)(uVar1 | c)) {
      if ((c != 0) && ((int)(0x7fffffffU / (uint)c) < (int)uVar1)) {
        return 0;
      }
      if ((int)(uVar1 * c) < 0) {
        return 0;
      }
      return (uint)(uVar1 * c < 0x20000000);
    }
  }
  return 0;
}

Assistant:

static int stbi__mad4sizes_valid(int a, int b, int c, int d, int add)
{
   return stbi__mul2sizes_valid(a, b) && stbi__mul2sizes_valid(a*b, c) &&
      stbi__mul2sizes_valid(a*b*c, d) && stbi__addsizes_valid(a*b*c*d, add);
}